

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

AcceptOnPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::AcceptOnPropertyExprSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&,slang::syntax::PropertyExprSyntax&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          PropertyExprSyntax *args_4)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  AcceptOnPropertyExprSyntax *pAVar16;
  
  pAVar16 = (AcceptOnPropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((AcceptOnPropertyExprSyntax *)this->endPtr < pAVar16 + 1) {
    pAVar16 = (AcceptOnPropertyExprSyntax *)allocateSlow(this,0x58,8);
  }
  else {
    this->head->current = (byte *)(pAVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pAVar16->super_PropertyExprSyntax).super_SyntaxNode.kind = AcceptOnPropertyExpr;
  (pAVar16->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pAVar16->super_PropertyExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pAVar16->keyword).kind = TVar4;
  (pAVar16->keyword).field_0x2 = uVar5;
  (pAVar16->keyword).numFlags = (NumericTokenFlags)NVar6.raw;
  (pAVar16->keyword).rawLen = uVar7;
  (pAVar16->keyword).info = pIVar1;
  (pAVar16->openParen).kind = TVar8;
  (pAVar16->openParen).field_0x2 = uVar9;
  (pAVar16->openParen).numFlags = (NumericTokenFlags)NVar10.raw;
  (pAVar16->openParen).rawLen = uVar11;
  (pAVar16->openParen).info = pIVar2;
  (pAVar16->condition).ptr = args_2;
  (pAVar16->closeParen).kind = TVar12;
  (pAVar16->closeParen).field_0x2 = uVar13;
  (pAVar16->closeParen).numFlags = (NumericTokenFlags)NVar14.raw;
  (pAVar16->closeParen).rawLen = uVar15;
  (pAVar16->closeParen).info = pIVar3;
  (pAVar16->expr).ptr = args_4;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pAVar16;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)pAVar16;
  return pAVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }